

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerWalFrames(Pager *pPager,PgHdr *pList,Pgno nTruncate,int isCommit)

{
  long lVar1;
  int iVar2;
  PgHdr **local_38;
  PgHdr **ppNext;
  PgHdr *p;
  int nList;
  int rc;
  int isCommit_local;
  Pgno nTruncate_local;
  PgHdr *pList_local;
  Pager *pPager_local;
  
  _isCommit_local = pList;
  pList_local = (PgHdr *)pPager;
  if (isCommit == 0) {
    p._0_4_ = 1;
  }
  else {
    local_38 = (PgHdr **)&isCommit_local;
    p._0_4_ = 0;
    for (ppNext = (PgHdr **)pList; *local_38 = (PgHdr *)ppNext, ppNext != (PgHdr **)0x0;
        ppNext = (PgHdr **)ppNext[3]) {
      if (*(uint *)(ppNext + 5) <= nTruncate) {
        local_38 = ppNext + 3;
        p._0_4_ = (int)p + 1;
      }
    }
  }
  *(int *)&pList_local[3].pPager = (int)p + *(int *)&pList_local[3].pPager;
  if (_isCommit_local->pgno == 1) {
    pager_write_changecounter(_isCommit_local);
  }
  iVar2._0_2_ = pList_local[2].flags;
  iVar2._2_2_ = pList_local[2].nRef;
  iVar2 = sqlite3WalFrames((Wal *)pList_local[4].pPage,iVar2,_isCommit_local,nTruncate,isCommit,
                           (uint)*(byte *)((long)&pList_local->pData + 7));
  if ((iVar2 == 0) &&
     (lVar1._0_4_ = pList_local[1].pgno, lVar1._4_2_ = pList_local[1].flags,
     lVar1._6_2_ = pList_local[1].nRef, lVar1 != 0)) {
    for (ppNext = (PgHdr **)_isCommit_local; ppNext != (PgHdr **)0x0; ppNext = (PgHdr **)ppNext[3])
    {
      sqlite3BackupUpdate(*(sqlite3_backup **)&pList_local[1].pgno,*(Pgno *)(ppNext + 5),
                          (u8 *)ppNext[1]);
    }
  }
  return iVar2;
}

Assistant:

static int pagerWalFrames(
  Pager *pPager,                  /* Pager object */
  PgHdr *pList,                   /* List of frames to log */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit                    /* True if this is a commit */
){
  int rc;                         /* Return code */
  int nList;                      /* Number of pages in pList */
  PgHdr *p;                       /* For looping over pages */

  assert( pPager->pWal );
  assert( pList );
#ifdef SQLITE_DEBUG
  /* Verify that the page list is in accending order */
  for(p=pList; p && p->pDirty; p=p->pDirty){
    assert( p->pgno < p->pDirty->pgno );
  }
#endif

  assert( pList->pDirty==0 || isCommit );
  if( isCommit ){
    /* If a WAL transaction is being committed, there is no point in writing
    ** any pages with page numbers greater than nTruncate into the WAL file.
    ** They will never be read by any client. So remove them from the pDirty
    ** list here. */
    PgHdr **ppNext = &pList;
    nList = 0;
    for(p=pList; (*ppNext = p)!=0; p=p->pDirty){
      if( p->pgno<=nTruncate ){
        ppNext = &p->pDirty;
        nList++;
      }
    }
    assert( pList );
  }else{
    nList = 1;
  }
  pPager->aStat[PAGER_STAT_WRITE] += nList;

  if( pList->pgno==1 ) pager_write_changecounter(pList);
  rc = sqlite3WalFrames(pPager->pWal, 
      pPager->pageSize, pList, nTruncate, isCommit, pPager->walSyncFlags
  );
  if( rc==SQLITE_OK && pPager->pBackup ){
    for(p=pList; p; p=p->pDirty){
      sqlite3BackupUpdate(pPager->pBackup, p->pgno, (u8 *)p->pData);
    }
  }

#ifdef SQLITE_CHECK_PAGES
  pList = sqlite3PcacheDirtyList(pPager->pPCache);
  for(p=pList; p; p=p->pDirty){
    pager_set_pagehash(p);
  }
#endif

  return rc;
}